

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

Action<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
* __thiscall
testing::internal::ReturnAction::operator_cast_to_Action
          (Action<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
           *__return_storage_ptr__,ReturnAction *this)

{
  _func_int **pp_Var1;
  ActionInterface<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  *impl;
  
  impl = (ActionInterface<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
          *)operator_new(0x20);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__Impl_00329190;
  *(undefined1 *)&impl[1]._vptr_ActionInterface = 0;
  impl[2]._vptr_ActionInterface = *(_func_int ***)this;
  pp_Var1 = *(_func_int ***)(this + 8);
  impl[3]._vptr_ActionInterface = pp_Var1;
  if (pp_Var1 != (_func_int **)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
      UNLOCK();
    }
    else {
      *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
    }
  }
  Action<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  ::Action(__return_storage_ptr__,impl);
  return __return_storage_ptr__;
}

Assistant:

operator Action<F>() const {  // NOLINT
    // Assert statement belongs here because this is the best place to verify
    // conditions on F. It produces the clearest error messages
    // in most compilers.
    // Impl really belongs in this scope as a local class but can't
    // because MSVC produces duplicate symbols in different translation units
    // in this case. Until MS fixes that bug we put Impl into the class scope
    // and put the typedef both here (for use in assert statement) and
    // in the Impl class. But both definitions must be the same.
    typedef typename Function<F>::Result Result;
    GTEST_COMPILE_ASSERT_(
        !std::is_reference<Result>::value,
        use_ReturnRef_instead_of_Return_to_return_a_reference);
    static_assert(!std::is_void<Result>::value,
                  "Can't use Return() on an action expected to return `void`.");
    return Action<F>(new Impl<R, F>(value_));
  }